

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzx.cpp
# Opt level: O3

bool mg::data::mzx_decompress(string *compressed,string *out,bool invert)

{
  undefined8 uVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  byte bVar13;
  ulong uVar15;
  int iVar16;
  byte bVar17;
  bool bVar19;
  undefined4 uVar20;
  undefined1 auVar21 [16];
  uint16_t auStack_c8 [4];
  uint16_t ring_buffer [64];
  ushort uVar12;
  ushort uVar14;
  ushort uVar18;
  
  if (compressed->_M_string_length < 8) {
    mzx_decompress();
    bVar19 = false;
  }
  else {
    uVar1 = *(undefined8 *)(compressed->_M_dataplus)._M_p;
    bVar19 = (int)uVar1 == 0x30585a4d;
    if (bVar19) {
      std::__cxx11::string::resize((ulong)out,(char)((ulong)uVar1 >> 0x20));
      bVar17 = -invert;
      uVar18 = (ushort)bVar17;
      auVar21 = pshuflw(ZEXT216(CONCAT11(bVar17,bVar17)),ZEXT216(CONCAT11(bVar17,bVar17)),0);
      uVar20 = auVar21._0_4_;
      ring_buffer[0x34] = (uint16_t)uVar20;
      ring_buffer[0x35] = SUB42(uVar20,2);
      ring_buffer[0x36] = (uint16_t)uVar20;
      ring_buffer[0x37] = SUB42(uVar20,2);
      ring_buffer[0x38] = (uint16_t)uVar20;
      ring_buffer[0x39] = SUB42(uVar20,2);
      ring_buffer[0x3a] = (uint16_t)uVar20;
      ring_buffer[0x3b] = SUB42(uVar20,2);
      ring_buffer[0x2c] = (uint16_t)uVar20;
      ring_buffer[0x2d] = SUB42(uVar20,2);
      ring_buffer[0x2e] = (uint16_t)uVar20;
      ring_buffer[0x2f] = SUB42(uVar20,2);
      ring_buffer[0x30] = (uint16_t)uVar20;
      ring_buffer[0x31] = SUB42(uVar20,2);
      ring_buffer[0x32] = (uint16_t)uVar20;
      ring_buffer[0x33] = SUB42(uVar20,2);
      ring_buffer[0x24] = (uint16_t)uVar20;
      ring_buffer[0x25] = SUB42(uVar20,2);
      ring_buffer[0x26] = (uint16_t)uVar20;
      ring_buffer[0x27] = SUB42(uVar20,2);
      ring_buffer[0x28] = (uint16_t)uVar20;
      ring_buffer[0x29] = SUB42(uVar20,2);
      ring_buffer[0x2a] = (uint16_t)uVar20;
      ring_buffer[0x2b] = SUB42(uVar20,2);
      ring_buffer[0x1c] = (uint16_t)uVar20;
      ring_buffer[0x1d] = SUB42(uVar20,2);
      ring_buffer[0x1e] = (uint16_t)uVar20;
      ring_buffer[0x1f] = SUB42(uVar20,2);
      ring_buffer[0x20] = (uint16_t)uVar20;
      ring_buffer[0x21] = SUB42(uVar20,2);
      ring_buffer[0x22] = (uint16_t)uVar20;
      ring_buffer[0x23] = SUB42(uVar20,2);
      ring_buffer[0x14] = (uint16_t)uVar20;
      ring_buffer[0x15] = SUB42(uVar20,2);
      ring_buffer[0x16] = (uint16_t)uVar20;
      ring_buffer[0x17] = SUB42(uVar20,2);
      ring_buffer[0x18] = (uint16_t)uVar20;
      ring_buffer[0x19] = SUB42(uVar20,2);
      ring_buffer[0x1a] = (uint16_t)uVar20;
      ring_buffer[0x1b] = SUB42(uVar20,2);
      ring_buffer[0xc] = (uint16_t)uVar20;
      ring_buffer[0xd] = SUB42(uVar20,2);
      ring_buffer[0xe] = (uint16_t)uVar20;
      ring_buffer[0xf] = SUB42(uVar20,2);
      ring_buffer[0x10] = (uint16_t)uVar20;
      ring_buffer[0x11] = SUB42(uVar20,2);
      ring_buffer[0x12] = (uint16_t)uVar20;
      ring_buffer[0x13] = SUB42(uVar20,2);
      ring_buffer[4] = (uint16_t)uVar20;
      ring_buffer[5] = SUB42(uVar20,2);
      ring_buffer[6] = (uint16_t)uVar20;
      ring_buffer[7] = SUB42(uVar20,2);
      ring_buffer[8] = (uint16_t)uVar20;
      ring_buffer[9] = SUB42(uVar20,2);
      ring_buffer[10] = (uint16_t)uVar20;
      ring_buffer[0xb] = SUB42(uVar20,2);
      auStack_c8[0] = (uint16_t)uVar20;
      auStack_c8[1] = SUB42(uVar20,2);
      auStack_c8[2] = (uint16_t)uVar20;
      auStack_c8[3] = SUB42(uVar20,2);
      ring_buffer[0] = (uint16_t)uVar20;
      ring_buffer[1] = SUB42(uVar20,2);
      ring_buffer[2] = (uint16_t)uVar20;
      ring_buffer[3] = SUB42(uVar20,2);
      if (8 < compressed->_M_string_length) {
        uVar8 = 8;
        uVar9 = 0;
        uVar10 = 0;
        bVar3 = false;
        uVar12 = uVar18;
        uVar14 = uVar18;
        do {
          uVar15 = uVar8 + 1;
          pcVar2 = (compressed->_M_dataplus)._M_p;
          bVar11 = pcVar2[uVar8];
          uVar6 = bVar11 & 3;
          bVar11 = bVar11 >> 2;
          bVar4 = bVar3;
          if (!bVar3) {
            bVar4 = true;
            uVar14 = uVar18;
          }
          uVar12 = uVar12 & 0xff;
          if (!bVar3) {
            uVar12 = uVar18;
          }
          switch(uVar6) {
          case 0:
            iVar16 = (bVar11 - uVar6) + 1;
            do {
              uVar8 = out->_M_string_length;
              if (uVar10 < uVar8) {
                (out->_M_dataplus)._M_p[uVar10] = (char)uVar12;
                uVar10 = uVar10 + 1;
                uVar8 = out->_M_string_length;
              }
              if (uVar10 < uVar8) {
                (out->_M_dataplus)._M_p[uVar10] = (char)uVar14;
                uVar10 = uVar10 + 1;
              }
              iVar16 = iVar16 + -1;
              uVar8 = uVar15;
            } while (iVar16 != 0);
            break;
          case 1:
            bVar13 = pcVar2[uVar15];
            iVar16 = bVar11 + 1;
            do {
              lVar5 = uVar10 - (uint)bVar13 * 2;
              pcVar2 = (out->_M_dataplus)._M_p;
              uVar15 = out->_M_string_length;
              uVar12 = (ushort)(byte)pcVar2[lVar5 + -2];
              bVar11 = pcVar2[lVar5 + -1];
              uVar14 = (ushort)bVar11;
              if (uVar10 < uVar15) {
                pcVar2[uVar10] = pcVar2[lVar5 + -2];
                uVar10 = uVar10 + 1;
                uVar15 = out->_M_string_length;
              }
              if (uVar10 < uVar15) {
                (out->_M_dataplus)._M_p[uVar10] = bVar11;
                uVar10 = uVar10 + 1;
              }
              iVar16 = iVar16 + -1;
            } while (iVar16 != 0);
            uVar8 = uVar8 + 2;
            break;
          case 2:
            uVar12 = auStack_c8[bVar11];
            uVar7 = out->_M_string_length;
            if (uVar10 < uVar7) {
              (out->_M_dataplus)._M_p[uVar10] = (char)uVar12;
              uVar10 = uVar10 + 1;
              uVar7 = out->_M_string_length;
            }
            uVar14 = uVar12 >> 8;
            uVar8 = uVar15;
            if (uVar10 < uVar7) {
              (out->_M_dataplus)._M_p[uVar10] = (char)(uVar12 >> 8);
              uVar10 = uVar10 + 1;
            }
            break;
          case 3:
            iVar16 = bVar11 + 1;
            do {
              pcVar2 = (compressed->_M_dataplus)._M_p;
              bVar11 = pcVar2[uVar15] ^ bVar17;
              uVar12 = (ushort)bVar11;
              bVar13 = pcVar2[uVar15 + 1] ^ bVar17;
              uVar14 = (ushort)bVar13;
              uVar8 = out->_M_string_length;
              if (uVar10 < uVar8) {
                (out->_M_dataplus)._M_p[uVar10] = bVar11;
                uVar10 = uVar10 + 1;
                uVar8 = out->_M_string_length;
              }
              if (uVar10 < uVar8) {
                (out->_M_dataplus)._M_p[uVar10] = bVar13;
                uVar10 = uVar10 + 1;
              }
              auStack_c8[uVar9] = CONCAT11(bVar13,bVar11);
              uVar9 = (ulong)((int)uVar9 + 1U & 0x3f);
              uVar15 = uVar15 + 2;
              iVar16 = iVar16 + -1;
              uVar8 = uVar15;
            } while (iVar16 != 0);
          }
          bVar3 = bVar4;
        } while (uVar8 < compressed->_M_string_length);
      }
    }
    else {
      mzx_decompress();
    }
  }
  return bVar19;
}

Assistant:

bool mzx_decompress(const std::string &compressed, std::string &out,
                    bool invert) {
  // If header is too small, bail immediately
  if (compressed.size() < sizeof(MzxHeader)) {
    fprintf(stderr, "Header too small\n");
    return false;
  }

  // Pun start of data stream into header
  MzxHeader header = *reinterpret_cast<const MzxHeader *>(compressed.data());
  header.to_host_order();

  // If the magic doesn't match, do not try and uncompress
  if (memcmp(header.magic, MzxHeader::FILE_MAGIC, sizeof(header.magic)) != 0) {
    fprintf(stderr, "Invalid file magic\n");
    return false;
  }

  // Resize output buffer to accomodate decompressed data
  out.resize(header.decompressed_size);

  // Last written short
  uint8_t last[2];
  memset(last, invert ? 0xFF : 0x00, sizeof(last));

  // Ring buffer
  uint16_t ring_buffer[64];
  memset(ring_buffer, invert ? 0xFF : 0x00, sizeof(ring_buffer));

  // Clear counter. Last data is reinitialized on zero.
  int clear_count = 0;

  // Start reading right after the header
  std::string::size_type read_offset = sizeof(MzxHeader);
  std::string::size_type decompress_offset = 0;
  unsigned ring_buffer_write_offset = 0;
  while (read_offset < compressed.size()) {
    // Get type / len
    const uint8_t len_cmd = compressed[read_offset++];
    const unsigned cmd = len_cmd & 0b11;
    const unsigned len = len_cmd >> 2;

    // Reset counter
    if (clear_count <= 0) {
      clear_count = 0x1000;
      memset(last, invert ? 0xFF : 0x00, sizeof(last));
    }

    auto emit_byte = [&](uint8_t byte) {
      if (decompress_offset >= out.size()) {
        // fprintf(stderr, "Tried to write %d bytes past end of buffer: %02x\n",
        //         (int)decompress_offset - (int)out.size(), byte);
        return;
      }
      out[decompress_offset++] = byte;
    };

    switch (cmd) {

    case CMD_RLE: {
      // Repeat last two bytes len + 1 times
      for (unsigned i = 0; i <= len; i++) {
        emit_byte(last[0]);
        emit_byte(last[1]);
      }
    } break;

    case CMD_BACKREF: {
      const int lookback_distance =
          2 * (static_cast<uint8_t>(compressed[read_offset++]) + 1);
      for (unsigned i = 0; i <= len; i++) {
        const std::string::size_type lookback_offset =
            decompress_offset - lookback_distance;

        // Read 2 bytes into last buffer
        last[0] = out[lookback_offset];
        last[1] = out[lookback_offset + 1];

        // Write those bytes to end of stream
        emit_byte(last[0]);
        emit_byte(last[1]);
      }
    } break;

    case CMD_RINGBUF: {
      // Load ring buffer data at position len into last
      *reinterpret_cast<uint16_t *>(last) = ring_buffer[len];

      // Emit last
      emit_byte(last[0]);
      emit_byte(last[1]);
    } break;

    case CMD_LITERAL: {
      for (unsigned i = 0; i <= len; i++) {
        const uint8_t r0 = compressed[read_offset++] ^ (invert ? 0xFF : 0x00);
        const uint8_t r1 = compressed[read_offset++] ^ (invert ? 0xFF : 0x00);

        // Update last
        last[0] = r0;
        last[1] = r1;

        // Emit data
        emit_byte(last[0]);
        emit_byte(last[1]);

        // Write to ring buffer
        ring_buffer[ring_buffer_write_offset++] = (r1 << 8) | r0;
        ring_buffer_write_offset &= 0x3f;
      }
      break;
    }
    }
  }

  return true;
}